

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer pbVar1;
  cmOSXBundleGenerator *pcVar2;
  TargetType TVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmOSXBundleGenerator *this_00;
  pointer config;
  string local_50;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00a54a50;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != OBJECT_LIBRARY) {
    pvVar4 = cmCommonTargetGenerator::GetConfigNames_abi_cxx11_((cmCommonTargetGenerator *)this);
    config = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (config != pbVar1) {
      do {
        cmGeneratorTarget::GetDirectory(&local_50,target,config,RuntimeBinaryArtifact);
        cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_50)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        config = config + 1;
      } while (config != pbVar1);
    }
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x20);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target);
  pcVar2 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = this_00;
  if (pcVar2 != (cmOSXBundleGenerator *)0x0) {
    operator_delete(pcVar2,0x20);
  }
  ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
{
  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    for (auto const& config : this->GetConfigNames()) {
      this->EnsureDirectoryExists(target->GetDirectory(config));
    }
  }

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}